

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O3

void check_tlist(tri_idx_list_t *tlist,uint *N)

{
  pointer pMVar1;
  ostream *poVar2;
  runtime_error *this;
  long lVar3;
  long lVar4;
  long lVar5;
  stringstream ss;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pMVar1 = (tlist->
           super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(tlist->
                super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 2) * -0x5555555555555555;
    lVar5 = 0;
    do {
      lVar4 = 0;
      do {
        if (*N <= *(uint *)((long)&(pMVar1->
                                   super_PlainObjectBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>
                                   ).m_storage.m_data + lVar4)) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Failed to ensure condition ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"is_in_range(tlist[t][v],0,N)",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"at (",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"check_tlist",0xb);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
          poVar2 = (ostream *)std::ostream::operator<<(local_1a8,0x2a0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") \n ",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"tri vertex out of range",0x17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"t",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"tlist[t][v]",0xb);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::endl<char,std::char_traits<char>>(poVar2);
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(this,asStack_1d8);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
      lVar5 = lVar5 + 1;
      pMVar1 = pMVar1 + 1;
    } while (lVar5 != lVar3 + (ulong)(lVar3 == 0));
  }
  return;
}

Assistant:

void check_tlist(const tri_cc_t::tri_idx_list_t &tlist,const uint & N)
{
  for ( int t = 0 ; t < tlist.size(); ++t )
  {
    for( int v = 0 ; v < 3 ; ++v)
    {
      ENSURES(is_in_range(tlist[t][v],0,N))
          << "tri vertex out of range"
          <<STRMVAR(t)
          <<STRMVAR(tlist[t][v])
          <<endl;
    }
  }
}